

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O0

bool __thiscall
Js::PathTypeHandlerBase::GetPropertyEquivalenceInfo
          (PathTypeHandlerBase *this,PropertyRecord *propertyRecord,PropertyEquivalenceInfo *info)

{
  uint16 uVar1;
  PropertyIndex slotIndex;
  PropertyIndex PVar2;
  PropertyId propId;
  TypePath *this_00;
  PropertyIndex absSlotIndex;
  PropertyEquivalenceInfo *info_local;
  PropertyRecord *propertyRecord_local;
  PathTypeHandlerBase *this_local;
  
  this_00 = GetTypePath(this);
  propId = PropertyRecord::GetPropertyId(propertyRecord);
  uVar1 = GetPathLength(this);
  slotIndex = TypePath::LookupInline(this_00,propId,(uint)uVar1);
  PVar2 = DynamicTypeHandler::AdjustSlotIndexForInlineSlots
                    (&this->super_DynamicTypeHandler,slotIndex);
  info->slotIndex = PVar2;
  info->isAuxSlot = (this->super_DynamicTypeHandler).inlineSlotCapacity <= slotIndex;
  info->isWritable = info->slotIndex != 0xffff;
  return info->slotIndex != 0xffff;
}

Assistant:

bool PathTypeHandlerBase::GetPropertyEquivalenceInfo(PropertyRecord const* propertyRecord, PropertyEquivalenceInfo& info)
    {
        Js::PropertyIndex absSlotIndex = GetTypePath()->LookupInline(propertyRecord->GetPropertyId(), GetPathLength());
        info.slotIndex = AdjustSlotIndexForInlineSlots(absSlotIndex);
        info.isAuxSlot = absSlotIndex >= this->inlineSlotCapacity;
        info.isWritable = info.slotIndex != Constants::NoSlot;
        return info.slotIndex != Constants::NoSlot;
    }